

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O0

Property * Assimp::FBX::anon_unknown_8::ReadTypedProperty(Element *element)

{
  int iVar1;
  const_reference ppTVar2;
  Element *pEVar3;
  Token *t;
  Token *t_00;
  float _x;
  float _y;
  float _z;
  float local_b0;
  aiVector3t<float> local_ac;
  int64_t local_a0;
  uint64_t local_98;
  int local_90;
  bool local_89 [8];
  undefined1 local_81;
  string local_80;
  char *local_50;
  char *cs;
  char **local_28;
  string *s;
  TokenList *tok;
  Element *element_local;
  
  tok = (TokenList *)element;
  s = (string *)Element::Tokens(element);
  ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                        *)s,1);
  ParseTokenAsString_abi_cxx11_((string *)&cs,(FBX *)*ppTVar2,t);
  local_28 = &cs;
  local_50 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(local_50,"KString");
  if (iVar1 == 0) {
    pEVar3 = (Element *)operator_new(0x28);
    local_81 = 1;
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                          *)s,4);
    ParseTokenAsString_abi_cxx11_(&local_80,(FBX *)*ppTVar2,t_00);
    TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::TypedProperty((TypedProperty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pEVar3,&local_80);
    local_81 = 0;
    element_local = pEVar3;
    std::__cxx11::string::~string((string *)&local_80);
  }
  else {
    iVar1 = strcmp(local_50,"bool");
    if (iVar1 != 0) {
      iVar1 = strcmp(local_50,"Bool");
      if (iVar1 != 0) {
        iVar1 = strcmp(local_50,"int");
        if (iVar1 != 0) {
          iVar1 = strcmp(local_50,"Int");
          if (iVar1 != 0) {
            iVar1 = strcmp(local_50,"enum");
            if (iVar1 != 0) {
              iVar1 = strcmp(local_50,"Enum");
              if (iVar1 != 0) {
                iVar1 = strcmp(local_50,"ULongLong");
                if (iVar1 == 0) {
                  pEVar3 = (Element *)operator_new(0x10);
                  ppTVar2 = std::
                            vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                          *)s,4);
                  local_98 = ParseTokenAsID(*ppTVar2);
                  TypedProperty<unsigned_long>::TypedProperty
                            ((TypedProperty<unsigned_long> *)pEVar3,&local_98);
                  element_local = pEVar3;
                }
                else {
                  iVar1 = strcmp(local_50,"KTime");
                  if (iVar1 == 0) {
                    pEVar3 = (Element *)operator_new(0x10);
                    ppTVar2 = std::
                              vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                              ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                            *)s,4);
                    local_a0 = ParseTokenAsInt64(*ppTVar2);
                    TypedProperty<long>::TypedProperty((TypedProperty<long> *)pEVar3,&local_a0);
                    element_local = pEVar3;
                  }
                  else {
                    iVar1 = strcmp(local_50,"Vector3D");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(local_50,"ColorRGB");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(local_50,"Vector");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(local_50,"Color");
                          if (iVar1 != 0) {
                            iVar1 = strcmp(local_50,"Lcl Translation");
                            if (iVar1 != 0) {
                              iVar1 = strcmp(local_50,"Lcl Rotation");
                              if (iVar1 != 0) {
                                iVar1 = strcmp(local_50,"Lcl Scaling");
                                if (iVar1 != 0) {
                                  iVar1 = strcmp(local_50,"double");
                                  if (iVar1 != 0) {
                                    iVar1 = strcmp(local_50,"Number");
                                    if (iVar1 != 0) {
                                      iVar1 = strcmp(local_50,"Float");
                                      if (iVar1 != 0) {
                                        iVar1 = strcmp(local_50,"FieldOfView");
                                        if (iVar1 != 0) {
                                          iVar1 = strcmp(local_50,"UnitScaleFactor");
                                          if (iVar1 != 0) {
                                            element_local = (Element *)0x0;
                                            goto LAB_002160be;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  pEVar3 = (Element *)operator_new(0x10);
                                  ppTVar2 = std::
                                            vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                            ::operator[]((
                                                  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                                  *)s,4);
                                  local_b0 = ParseTokenAsFloat(*ppTVar2);
                                  TypedProperty<float>::TypedProperty
                                            ((TypedProperty<float> *)pEVar3,&local_b0);
                                  element_local = pEVar3;
                                  goto LAB_002160be;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    pEVar3 = (Element *)operator_new(0x18);
                    ppTVar2 = std::
                              vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                              ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                            *)s,4);
                    _x = ParseTokenAsFloat(*ppTVar2);
                    ppTVar2 = std::
                              vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                              ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                            *)s,5);
                    _y = ParseTokenAsFloat(*ppTVar2);
                    ppTVar2 = std::
                              vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                              ::operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                            *)s,6);
                    _z = ParseTokenAsFloat(*ppTVar2);
                    aiVector3t<float>::aiVector3t(&local_ac,_x,_y,_z);
                    TypedProperty<aiVector3t<float>_>::TypedProperty
                              ((TypedProperty<aiVector3t<float>_> *)pEVar3,&local_ac);
                    element_local = pEVar3;
                  }
                }
                goto LAB_002160be;
              }
            }
          }
        }
        pEVar3 = (Element *)operator_new(0x10);
        ppTVar2 = std::
                  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
                  operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                              *)s,4);
        local_90 = ParseTokenAsInt(*ppTVar2);
        TypedProperty<int>::TypedProperty((TypedProperty<int> *)pEVar3,&local_90);
        element_local = pEVar3;
        goto LAB_002160be;
      }
    }
    pEVar3 = (Element *)operator_new(0x10);
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[]((vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                          *)s,4);
    iVar1 = ParseTokenAsInt(*ppTVar2);
    local_89[0] = iVar1 != 0;
    TypedProperty<bool>::TypedProperty((TypedProperty<bool> *)pEVar3,local_89);
    element_local = pEVar3;
  }
LAB_002160be:
  local_89[1] = true;
  local_89[2] = false;
  local_89[3] = false;
  local_89[4] = false;
  std::__cxx11::string::~string((string *)&cs);
  return (Property *)element_local;
}

Assistant:

Property* ReadTypedProperty(const Element& element)
{
    ai_assert(element.KeyToken().StringContents() == "P");

    const TokenList& tok = element.Tokens();
    ai_assert(tok.size() >= 5);

    const std::string& s = ParseTokenAsString(*tok[1]);
    const char* const cs = s.c_str();
    if (!strcmp(cs,"KString")) {
        return new TypedProperty<std::string>(ParseTokenAsString(*tok[4]));
    }
    else if (!strcmp(cs,"bool") || !strcmp(cs,"Bool")) {
        return new TypedProperty<bool>(ParseTokenAsInt(*tok[4]) != 0);
    }
    else if (!strcmp(cs, "int") || !strcmp(cs, "Int") || !strcmp(cs, "enum") || !strcmp(cs, "Enum")) {
        return new TypedProperty<int>(ParseTokenAsInt(*tok[4]));
    }
    else if (!strcmp(cs, "ULongLong")) {
        return new TypedProperty<uint64_t>(ParseTokenAsID(*tok[4]));
    }
    else if (!strcmp(cs, "KTime")) {
        return new TypedProperty<int64_t>(ParseTokenAsInt64(*tok[4]));
    }
    else if (!strcmp(cs,"Vector3D") ||
        !strcmp(cs,"ColorRGB") ||
        !strcmp(cs,"Vector") ||
        !strcmp(cs,"Color") ||
        !strcmp(cs,"Lcl Translation") ||
        !strcmp(cs,"Lcl Rotation") ||
        !strcmp(cs,"Lcl Scaling")
        ) {
        return new TypedProperty<aiVector3D>(aiVector3D(
            ParseTokenAsFloat(*tok[4]),
            ParseTokenAsFloat(*tok[5]),
            ParseTokenAsFloat(*tok[6]))
        );
    }
    else if (!strcmp(cs,"double") || !strcmp(cs,"Number") || !strcmp(cs,"Float") || !strcmp(cs,"FieldOfView") || !strcmp( cs, "UnitScaleFactor" ) ) {
        return new TypedProperty<float>(ParseTokenAsFloat(*tok[4]));
    }
    return NULL;
}